

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StoreLPJointObservation::MatchingJointObservations
          (StoreLPJointObservation *this,Index curAgent,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indIndices)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  size_type sVar4;
  undefined8 uVar5;
  DecPOMDPDiscrete *pDVar6;
  reference pvVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  uint in_ESI;
  long *in_RDI;
  Index oi;
  size_t nrObs;
  stringstream ss;
  E e;
  Index joI;
  stringstream msg;
  stringstream *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  value_type_conflict1 *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  uint uVar9;
  undefined4 in_stack_fffffffffffffb74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffba8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffbb0;
  uint local_38c;
  stringstream local_1a0 [16];
  ostream local_190 [368];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  Index curAgent_00;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar4 = *(size_type *)(*in_RDI + 0x48);
  pvVar10 = in_RDX;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  if (sVar4 == sVar2) {
    if ((ulong)in_ESI == *(ulong *)(*in_RDI + 0x48)) {
      pDVar6 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
      (**(code **)(*(long *)&(pDVar6->super_MultiAgentDecisionProcessDiscrete).
                             super_MultiAgentDecisionProcess + 0xe8))(pDVar6,in_RDX);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
    }
    else {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDX,(ulong)in_ESI);
      curAgent_00 = (Index)((ulong)pvVar10 >> 0x20);
      if (*pvVar7 == *(value_type *)(*in_RDI + 0x58)) {
        pDVar6 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
        uVar8 = (**(code **)(*(long *)&(pDVar6->super_MultiAgentDecisionProcessDiscrete).
                                       super_MultiAgentDecisionProcess + 200))(pDVar6,in_ESI);
        for (local_38c = 0; local_38c < uVar8; local_38c = local_38c + 1) {
          uVar9 = local_38c;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (in_RDX,(ulong)in_ESI);
          *pvVar7 = uVar9;
          iVar1 = in_ESI + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          MatchingJointObservations
                    ((StoreLPJointObservation *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (Index)((ulong)pvVar10 >> 0x20),in_stack_ffffffffffffffe0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(iVar1,uVar9));
        }
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        MatchingJointObservations
                  ((StoreLPJointObservation *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),curAgent_00
                   ,in_stack_ffffffffffffffe0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      }
    }
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"individual obs indices vector has wrong size. (");
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," while nrAgents is ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(*in_RDI + 0x48));
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,"at(");
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::get_position(*(position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                   **)(*in_RDI + 0x150));
  poVar3 = DPOMDPFormatParsing::operator<<
                     ((ostream *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                      (file_position *)in_stack_fffffffffffffb58);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar5 = __cxa_allocate_exception(0x28);
  EParse::EParse((EParse *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 in_stack_fffffffffffffb58);
  __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
}

Assistant:

void ParserDPOMDPFormat_Spirit::StoreLPJointObservation::MatchingJointObservations (Index curAgent, vector<Index> indIndices) const
{
    if(_m_po->_m_nrA != indIndices.size())
    {
        stringstream msg;
        msg << "individual obs indices vector has wrong size. ("<<indIndices.size() << 
            " while nrAgents is " <<_m_po->_m_nrA << ")" << "at(" << 
            _m_po->_m_first->get_position() << ")" << endl;;
        throw EParse(msg);
    }
    if(curAgent == _m_po->_m_nrA) //past last agent: all work done
    {
        Index joI = 0;
        try
        {
            joI = _m_po->GetDecPOMDPDiscrete()->IndividualToJointObservationIndices(
                    indIndices);
            _m_po->_m_lp_JOI.push_back(joI);
        }
        catch(E e)
        {
            stringstream ss; ss <<e.SoftPrint() << "at(" << _m_po->_m_first->get_position() <<
                ")" << endl;
            throw EParse(ss);
        }
        if(DEBUG_PARSE)
        {
            cout<<"MatchingJointObservations: joint observation index for < ";
            vector<Index>::iterator it = indIndices.begin();
            vector<Index>::iterator last = indIndices.end();
            while(it != last){ cout << *it <<" "; it++;}
            cout <<   "> = "<<joI<<endl;
        }
    }
    else //not past last agent: work to be done
    {
        if(indIndices[curAgent] == _m_po->_m_anyJOIndex)
        {
            //do for each action of this agent
            size_t nrObs = _m_po->GetDecPOMDPDiscrete()->GetNrObservations(curAgent);
            for(Index oi=0; oi < nrObs; oi++)
            {
                indIndices[curAgent] = oi;
                MatchingJointObservations(curAgent+1, indIndices);
            }
        }
        else
            MatchingJointObservations(curAgent+1, indIndices);
    }
}